

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

bool __thiscall qpdf::Array::erase(Array *this,int at)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  QPDF_Array *pQVar4;
  iterator __pos;
  _Base_ptr p_Var5;
  _Self __tmp;
  node_type nh;
  _Rb_tree_color local_74;
  node_type local_70;
  insert_return_type local_58;
  
  local_74 = at;
  pQVar4 = array(this);
  if ((-1 < at) && (iVar3 = size(this), at < iVar3)) {
    _Var1._M_head_impl =
         (pQVar4->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (Sparse *)0x0) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::erase
                (&pQVar4->elements,
                 (pQVar4->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_start + (uint)at);
    }
    else {
      p_Var2 = (_Rb_tree_header *)((long)&(_Var1._M_head_impl)->elements + 8);
      __pos = std::
              _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
              ::lower_bound(&((_Var1._M_head_impl)->elements)._M_t,(key_type *)&local_74);
      if ((_Rb_tree_header *)__pos._M_node != p_Var2) {
        if (__pos._M_node[1]._M_color == local_74) {
          __pos._M_node = (_Base_ptr)std::_Rb_tree_increment(__pos._M_node);
          std::
          _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::erase(&(((pQVar4->sp)._M_t.
                     super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                     .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->elements).
                   _M_t,(key_type *)&local_74);
        }
        while ((_Rb_tree_header *)__pos._M_node != p_Var2) {
          _Var1._M_head_impl =
               (pQVar4->sp)._M_t.
               super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
               _M_t.
               super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
               .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__pos._M_node);
          std::
          _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::extract(&local_70,&((_Var1._M_head_impl)->elements)._M_t,(const_iterator)__pos._M_node);
          *local_70._M_pkey = *local_70._M_pkey + -1;
          std::
          _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
          ::_M_reinsert_node_unique
                    (&local_58,
                     &(((pQVar4->sp)._M_t.
                        super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                        .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->elements)
                      ._M_t,&local_70);
          std::
          _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
          ::~_Node_handle_common
                    (&local_58.node.
                      super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    );
          std::
          _Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
          ::~_Node_handle_common
                    (&local_70.
                      super__Node_handle_common<std::pair<const_int,_QPDFObjectHandle>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QPDFObjectHandle>_>_>_>
                    );
          __pos._M_node = p_Var5;
        }
      }
      _Var1._M_head_impl =
           (pQVar4->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      (_Var1._M_head_impl)->size = (_Var1._M_head_impl)->size + -1;
    }
    return true;
  }
  return false;
}

Assistant:

bool
Array::erase(int at)
{
    auto a = array();
    if (at < 0 || at >= size()) {
        return false;
    }
    if (a->sp) {
        auto end = a->sp->elements.end();
        if (auto iter = a->sp->elements.lower_bound(at); iter != end) {
            if (iter->first == at) {
                iter++;
                a->sp->elements.erase(at);
            }

            while (iter != end) {
                auto nh = a->sp->elements.extract(iter++);
                --nh.key();
                a->sp->elements.insert(std::move(nh));
            }
        }
        --(a->sp->size);
    } else {
        a->elements.erase(a->elements.cbegin() + at);
    }
    return true;
}